

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
detail::writer::operator()(writer *this,optional_field<example::decimal_t,_1UL> *val)

{
  bool bVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  reference_const_type val_00;
  optional_field<example::decimal_t,_1UL> *val_local;
  writer *this_local;
  
  if (this->optv_ != (value_type *)0x0) {
    bVar1 = boost::optional<example::decimal_t>::operator!(&val->super_optional<example::decimal_t>)
    ;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::bitset<16UL>::set(&this->opts_);
      uVar3 = std::bitset<16UL>::to_ulong(&this->opts_);
      *this->optv_ = (value_type)uVar3;
      val_00 = boost::optional<example::decimal_t>::operator*
                         (&val->super_optional<example::decimal_t>);
      operator()(this,val_00);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> const& val) const {
        if (!optv_)
            throw bad_message();
        if (val) {
            opts_.set();
            *optv_ = static_cast<example::opt_fields::value_type>(opts_.to_ulong());
            (*this)(*val);
        }
    }